

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O0

void nite::graphicsInit(void)

{
  bool bVar1;
  int iVar2;
  GLenum GVar3;
  char *pcVar4;
  Indexer *pIVar5;
  ulong uVar6;
  size_type sVar7;
  reference pvVar8;
  longlong lVar9;
  EVP_PKEY_CTX *ctx;
  string *this;
  string *this_00;
  allocator local_313;
  byte local_312;
  allocator local_311;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  int local_230;
  allocator local_229;
  int c;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  char *local_188;
  char *n;
  Uint32 local_178;
  int i;
  int displayHeight;
  int displayWidth;
  SDL_DisplayMode DM;
  int Flags;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  Indexer *local_68;
  Indexer *indexer;
  allocator local_29;
  undefined1 local_28 [8];
  string err;
  
  updateDelta();
  printInit();
  this = (string *)0xf231;
  iVar2 = SDL_Init();
  if (iVar2 < 0) {
    pcVar4 = (char *)SDL_GetError();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_28,pcVar4,&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&indexer,
                   "fatal error: SDL was unable to start: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
    print((string *)&indexer);
    std::__cxx11::string::~string((string *)&indexer);
    gameExit();
    this = (string *)local_28;
    std::__cxx11::string::~string(this);
  }
  AsyncTask::init((EVP_PKEY_CTX *)this);
  socketInit();
  FileTransfer::init((EVP_PKEY_CTX *)this);
  inderxerInit();
  pIVar5 = getIndexer();
  local_68 = pIVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"./data/map/",&local_89);
  Indexer::indexDir(pIVar5,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  pIVar5 = local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"./data/tileset/",&local_b1);
  Indexer::indexDir(pIVar5,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  pIVar5 = local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"./data/texture/tileset/",&local_d9);
  Indexer::indexDir(pIVar5,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  pIVar5 = local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"./data/texture/overworld/",&local_101);
  Indexer::indexDir(pIVar5,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  pIVar5 = local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"./data/texture/weaps/",&local_129);
  Indexer::indexDir(pIVar5,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  pIVar5 = local_68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&Flags,"./data/texture/ammo/",(allocator *)((long)&DM.driverdata + 7));
  Indexer::indexDir(pIVar5,(string *)&Flags);
  std::__cxx11::string::~string((string *)&Flags);
  std::allocator<char>::~allocator((allocator<char> *)((long)&DM.driverdata + 7));
  signal(2,ctrlC);
  DM.driverdata._0_4_ = 2;
  SDL_GetCurrentDisplayMode(0,&displayHeight);
  i = displayWidth;
  local_178 = DM.format;
  readConfigFile();
  n._4_4_ = 0;
  do {
    uVar6 = (ulong)n._4_4_;
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&parameters_abi_cxx11_);
    if (sVar7 <= uVar6) {
      if ((enableFullscreen & 1U) != 0) {
        DM.driverdata._0_4_ = (uint)DM.driverdata | 1;
      }
      if ((enableBorderless & 1U) != 0) {
        DM.driverdata._0_4_ = (uint)DM.driverdata | 0x10;
      }
      if ((enableResizable & 1U) != 0) {
        DM.driverdata._0_4_ = (uint)DM.driverdata | 0x20;
      }
      if ((autoResolution & 1U) != 0) {
        Vec2::set(&::size,(float)i,(float)(int)local_178);
      }
      local_188 = "R E D   B I A S";
      SDL_GL_SetAttribute(0xd,1);
      SDL_GL_SetAttribute(0xe,0x10);
      glEnable(0x809d);
      Window = (SDL_Window *)
               SDL_CreateWindow(local_188,0x2fff0000,0x2fff0000,(int)::size.x,(int)::size.y,
                                (uint)DM.driverdata);
      if (Window == (SDL_Window *)0x0) {
        Vec2::str_abi_cxx11_(&local_208,&::size);
        std::operator+(&local_1e8,"failed to create window | size ",&local_208);
        std::operator+(&local_1c8,&local_1e8,": ");
        pcVar4 = (char *)SDL_GetError();
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&c,pcVar4,&local_229);
        std::operator+(&local_1a8,&local_1c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c);
        print(&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&c);
        std::allocator<char>::~allocator((allocator<char> *)&local_229);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1e8);
        this_00 = &local_208;
        std::__cxx11::string::~string((string *)this_00);
        exit((int)this_00);
      }
      ctx = (EVP_PKEY_CTX *)SDL_GL_CreateContext(Window);
      Context = ctx;
      SDL_GL_MakeCurrent(Window);
      GVar3 = glewInit();
      if (GVar3 != 0) {
        iVar2 = 0x36e6c8;
        print("GLEW failed to initialize.");
        exit(iVar2);
      }
      graphicsInitd = true;
      running = true;
      setupOpenGL();
      SDL_GL_SetSwapInterval((enableVSync & 1U) != 0);
      for (local_230 = 0; local_230 < 0xc; local_230 = local_230 + 1) {
        RenderTarget::init(targets + local_230,ctx);
      }
      std::operator+(&local_250,"nite engine | OS ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     niteCurrentPlatform_abi_cxx11_);
      print(&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      Vec2::str_abi_cxx11_(&local_2f0,&::size);
      std::operator+(&local_2d0,"graphics init ",&local_2f0);
      std::operator+(&local_2b0,&local_2d0," (");
      local_312 = 0;
      bVar1 = (enableFullscreen & 1U) == 0;
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_310,"windowed",&local_313);
      }
      else {
        std::allocator<char>::allocator();
        local_312 = 1;
        std::__cxx11::string::string((string *)&local_310,"fullscreen",&local_311);
      }
      std::operator+(&local_290,&local_2b0,&local_310);
      std::operator+(&local_270,&local_290,")");
      print(&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_310);
      if (bVar1) {
        std::allocator<char>::~allocator((allocator<char> *)&local_313);
      }
      if ((local_312 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_311);
      }
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      return;
    }
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&parameters_abi_cxx11_,(long)n._4_4_);
    bVar1 = std::operator==(pvVar8,"-wd");
    if (bVar1) {
LAB_00200529:
      enableFullscreen = true;
    }
    else {
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&parameters_abi_cxx11_,(long)n._4_4_);
      bVar1 = std::operator==(pvVar8,"--windowed");
      if (bVar1) goto LAB_00200529;
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&parameters_abi_cxx11_,(long)n._4_4_);
      bVar1 = std::operator==(pvVar8,"-ars");
      if (bVar1) {
LAB_002006ca:
        autoResolution = true;
      }
      else {
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&parameters_abi_cxx11_,(long)n._4_4_);
        bVar1 = std::operator==(pvVar8,"--auto-resolution");
        if (bVar1) goto LAB_002006ca;
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&parameters_abi_cxx11_,(long)n._4_4_);
        bVar1 = std::operator==(pvVar8,"-fs");
        if (bVar1) {
LAB_00200724:
          enableFullscreen = true;
        }
        else {
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&parameters_abi_cxx11_,(long)n._4_4_);
          bVar1 = std::operator==(pvVar8,"--fullscreen");
          if (bVar1) goto LAB_00200724;
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&parameters_abi_cxx11_,(long)n._4_4_);
          bVar1 = std::operator==(pvVar8,"-rs");
          if (bVar1) {
LAB_0020077e:
            enableResizable = true;
          }
          else {
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&parameters_abi_cxx11_,(long)n._4_4_);
            bVar1 = std::operator==(pvVar8,"--resizeable");
            if (bVar1) goto LAB_0020077e;
            pvVar8 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](&parameters_abi_cxx11_,(long)n._4_4_);
            bVar1 = std::operator==(pvVar8,"-bdl");
            if (bVar1) {
LAB_002007d8:
              enableBorderless = true;
            }
            else {
              pvVar8 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&parameters_abi_cxx11_,(long)n._4_4_);
              bVar1 = std::operator==(pvVar8,"--borderless");
              if (bVar1) goto LAB_002007d8;
              pvVar8 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&parameters_abi_cxx11_,(long)n._4_4_);
              bVar1 = std::operator==(pvVar8,"-w");
              if (bVar1) {
LAB_00200832:
                uVar6 = (ulong)n._4_4_;
                sVar7 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size(&parameters_abi_cxx11_);
                if (sVar7 - 1 <= uVar6) goto LAB_00200891;
                pvVar8 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](&parameters_abi_cxx11_,(long)(n._4_4_ + 1));
                lVar9 = toInt(pvVar8);
                ::size.x = (float)lVar9;
              }
              else {
                pvVar8 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](&parameters_abi_cxx11_,(long)n._4_4_);
                bVar1 = std::operator==(pvVar8,"--width");
                if (bVar1) goto LAB_00200832;
LAB_00200891:
                pvVar8 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](&parameters_abi_cxx11_,(long)n._4_4_);
                bVar1 = std::operator==(pvVar8,"-h");
                if (bVar1) {
LAB_002008df:
                  uVar6 = (ulong)n._4_4_;
                  sVar7 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::size(&parameters_abi_cxx11_);
                  if (uVar6 < sVar7 - 1) {
                    pvVar8 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[](&parameters_abi_cxx11_,(long)(n._4_4_ + 1));
                    lVar9 = toInt(pvVar8);
                    ::size.y = (float)lVar9;
                    goto LAB_002009fa;
                  }
                }
                else {
                  pvVar8 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](&parameters_abi_cxx11_,(long)n._4_4_);
                  bVar1 = std::operator==(pvVar8,"--height");
                  if (bVar1) goto LAB_002008df;
                }
                pvVar8 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](&parameters_abi_cxx11_,(long)n._4_4_);
                bVar1 = std::operator==(pvVar8,"-vsync");
                if (!bVar1) {
                  pvVar8 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](&parameters_abi_cxx11_,(long)n._4_4_);
                  bVar1 = std::operator==(pvVar8,"--vertical-synchronization");
                  if (!bVar1) {
                    pvVar8 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::operator[](&parameters_abi_cxx11_,(long)n._4_4_);
                    bVar1 = std::operator==(pvVar8,"-nvsync");
                    if (!bVar1) {
                      pvVar8 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::operator[](&parameters_abi_cxx11_,(long)n._4_4_);
                      bVar1 = std::operator==(pvVar8,"--no-vertical-synchronization");
                      if (!bVar1) goto LAB_002009fa;
                    }
                    enableVSync = false;
                    goto LAB_002009fa;
                  }
                }
                enableVSync = true;
              }
            }
          }
        }
      }
    }
LAB_002009fa:
    n._4_4_ = n._4_4_ + 1;
  } while( true );
}

Assistant:

void nite::graphicsInit(){
	nite::updateDelta();
	nite::printInit();
	if (SDL_Init(SDL_INIT_EVERYTHING) < 0){
		String err = SDL_GetError();
		nite::print("fatal error: SDL was unable to start: "+err);
		 gameExit();
	}
	nite::AsyncTask::init();
	nite::socketInit();
	nite::FileTransfer::init();
	nite::inderxerInit();
    auto indexer = nite::getIndexer();
    indexer->indexDir("./data/map/");
    indexer->indexDir("./data/tileset/");
    indexer->indexDir("./data/texture/tileset/");
	indexer->indexDir("./data/texture/overworld/");
	indexer->indexDir("./data/texture/weaps/");
	indexer->indexDir("./data/texture/ammo/");
	signal(SIGINT, ctrlC);

	int Flags = SDL_WINDOW_OPENGL;

	SDL_DisplayMode DM;
	SDL_GetCurrentDisplayMode(0, &DM);
	auto displayWidth = DM.w;
	auto displayHeight = DM.h;

	readConfigFile();

	for(int i = 0; i < parameters.size(); ++i){
		if(parameters[i] == "-wd" || parameters[i] == "--windowed"){
			enableFullscreen = true;
		}else		
		if(parameters[i] == "-ars" || parameters[i] == "--auto-resolution"){
			autoResolution = true;
		}else
		if(parameters[i] == "-fs" || parameters[i] == "--fullscreen"){
			enableFullscreen = true;
		}else
		if(parameters[i] == "-rs" || parameters[i] == "--resizeable"){
			enableResizable = true;
		}else
		if(parameters[i] == "-bdl" || parameters[i] == "--borderless"){
			enableBorderless = true;
		}else
		if((parameters[i] == "-w" || parameters[i] == "--width") && i < parameters.size()-1){
			size.x = nite::toInt(parameters[i+1]);
		}else
		if((parameters[i] == "-h" || parameters[i] == "--height") && i < parameters.size()-1){
			size.y = nite::toInt(parameters[i+1]);
		}else
		if((parameters[i] == "-vsync" || parameters[i] == "--vertical-synchronization")){
			enableVSync = true;
		}else
		if((parameters[i] == "-nvsync" || parameters[i] == "--no-vertical-synchronization")){
			enableVSync = false;
		}											
	}

	if(enableFullscreen){
		Flags |= SDL_WINDOW_FULLSCREEN;
	}
	if(enableBorderless){
		Flags |= SDL_WINDOW_BORDERLESS;
	}
	if(enableResizable){
		Flags |= SDL_WINDOW_RESIZABLE;
	}
	if(autoResolution){
		size.set(displayWidth, displayHeight);
	}

	const char *n = "R E D   B I A S";

   SDL_GL_SetAttribute(SDL_GL_MULTISAMPLEBUFFERS, 1);
   SDL_GL_SetAttribute(SDL_GL_MULTISAMPLESAMPLES, 16);
   glEnable(GL_MULTISAMPLE);

	Window = SDL_CreateWindow(n, SDL_WINDOWPOS_CENTERED, SDL_WINDOWPOS_CENTERED, size.x, size.y, Flags);
	
	if(Window == NULL){
		nite::print("failed to create window | size "+size.str()+": "+String(SDL_GetError()));
		nite::exit();
	}
	
	Context = SDL_GL_CreateContext(Window);
	SDL_GL_MakeCurrent(Window, Context);

	if (glewInit() != GLEW_OK){
		nite::print("GLEW failed to initialize.");
		nite::exit();
	}

	graphicsInitd = true;
	running = true;

	setupOpenGL();
	SDL_GL_SetSwapInterval(enableVSync ? 1 : 0);
	for(int c = 0; c < RenderTargetNumber; ++c){
		targets[c].init();
	}

	nite::print("nite engine | OS "+niteCurrentPlatform);
	nite::print("graphics init "+size.str()+" ("+(enableFullscreen ? String("fullscreen") : String("windowed"))+")");
	// debugFont.load("data/font/VeraMono.ttf", 18 * nite::getGeneralScale());
}